

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int kinLsDQJtimes(N_Vector v,N_Vector Jv,N_Vector u,int *new_u,void *kinmem)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  int retval;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  sunrealtype vtv;
  sunrealtype sign;
  sunrealtype sq1norm;
  sunrealtype sutsv;
  sunrealtype sigma_inv;
  sunrealtype sigma;
  KINMem *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  long local_70;
  KINMem local_68;
  int local_4;
  
  local_4 = kinLs_AccessLMem((void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                             (KINLsMem *)0x11509b);
  if (local_4 == 0) {
    if ((((*(long *)(*(long *)(in_RDI + 8) + 0x68) == 0) ||
         (*(long *)(*(long *)(in_RDI + 8) + 0x98) == 0)) ||
        (*(long *)(*(long *)(in_RDI + 8) + 200) == 0)) ||
       (*(long *)(*(long *)(in_RDI + 8) + 0x58) == 0)) {
      KINProcessError(local_68,-3,0x3c2,"kinLsDQJtimes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"A required vector operation is not implemented.");
      local_4 = -3;
    }
    else {
      N_VProd(in_RDI,local_68->kin_uscale,local_68->kin_vtemp1);
      N_VProd(in_RDX,local_68->kin_uscale,in_RSI);
      dVar1 = (double)N_VDotProd(in_RSI,local_68->kin_vtemp1);
      dVar2 = (double)N_VDotProd(local_68->kin_vtemp1,local_68->kin_vtemp1);
      dVar3 = (double)N_VL1Norm(local_68->kin_vtemp1);
      if (dVar3 < ABS(dVar1)) {
        dVar3 = ABS(dVar1);
      }
      dVar2 = ((double)(~-(ulong)(0.0 <= dVar1) & 0xbff0000000000000 |
                       -(ulong)(0.0 <= dVar1) & 0x3ff0000000000000) * local_68->kin_sqrt_relfunc *
              dVar3) / dVar2;
      dVar1 = 1.0 / dVar2;
      N_VLinearSum(0x3ff0000000000000,dVar2,in_RDX,in_RDI,local_68->kin_vtemp1);
      local_4 = (**(code **)(local_70 + 0xa8))
                          (local_68->kin_vtemp1,local_68->kin_vtemp2,local_68->kin_user_data);
      *(long *)(local_70 + 0x40) = *(long *)(local_70 + 0x40) + 1;
      if (local_4 == 0) {
        N_VLinearSum(dVar1,-dVar1,local_68->kin_vtemp2,local_68->kin_fval,in_RSI);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int kinLsDQJtimes(N_Vector v, N_Vector Jv, N_Vector u,
                  SUNDIALS_MAYBE_UNUSED sunbooleantype* new_u, void* kinmem)
{
  sunrealtype sigma, sigma_inv, sutsv, sq1norm, sign, vtv;
  KINMem kin_mem;
  KINLsMem kinls_mem;
  int retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* ensure that NVector supplies requisite routines */
  if ((v->ops->nvprod == NULL) || (v->ops->nvdotprod == NULL) ||
      (v->ops->nvl1norm == NULL) || (v->ops->nvlinearsum == NULL))
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_NVECTOR);
    return (KINLS_ILL_INPUT);
  }

  /* scale the vector v and put Du*v into vtemp1 */
  N_VProd(v, kin_mem->kin_uscale, kin_mem->kin_vtemp1);

  /* scale u and put into Jv (used as a temporary storage) */
  N_VProd(u, kin_mem->kin_uscale, Jv);

  /* compute dot product (Du*u).(Du*v) */
  sutsv = N_VDotProd(Jv, kin_mem->kin_vtemp1);

  /* compute dot product (Du*v).(Du*v) */
  vtv = N_VDotProd(kin_mem->kin_vtemp1, kin_mem->kin_vtemp1);

  /* compute differencing factor -- this is from p. 469, Brown and Saad paper */
  sq1norm = N_VL1Norm(kin_mem->kin_vtemp1);
  sign    = (sutsv >= ZERO) ? ONE : -ONE;
  sigma = sign * (kin_mem->kin_sqrt_relfunc) * SUNMAX(SUNRabs(sutsv), sq1norm) /
          vtv;
  sigma_inv = ONE / sigma;

  /* compute the u-prime at which to evaluate the function func */
  N_VLinearSum(ONE, u, sigma, v, kin_mem->kin_vtemp1);

  /* call the system function to calculate func(u+sigma*v) */
  retval = kinls_mem->jt_func(kin_mem->kin_vtemp1, kin_mem->kin_vtemp2,
                              kin_mem->kin_user_data);
  kinls_mem->nfeDQ++;
  if (retval != 0) { return (retval); }

  /* finish the computation of the difference quotient */
  N_VLinearSum(sigma_inv, kin_mem->kin_vtemp2, -sigma_inv, kin_mem->kin_fval, Jv);

  return (0);
}